

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void rhash_md5_update(md5_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t local_48;
  md5_ctx *local_30;
  uint *aligned_message_block;
  uint left;
  uint index;
  size_t size_local;
  uchar *msg_local;
  md5_ctx *ctx_local;
  
  uVar1 = ctx->length;
  uVar2 = (uint)uVar1 & 0x3f;
  ctx->length = size + ctx->length;
  _left = size;
  size_local = (size_t)msg;
  if ((uVar1 & 0x3f) != 0) {
    uVar3 = 0x40 - uVar2;
    local_48 = size;
    if (uVar3 <= size) {
      local_48 = (size_t)uVar3;
    }
    memcpy((void *)((long)ctx->message + (ulong)uVar2),msg,local_48);
    if (size < uVar3) {
      return;
    }
    rhash_md5_process_block(ctx->hash,ctx->message);
    size_local = (size_t)(msg + uVar3);
    _left = size - uVar3;
  }
  for (; 0x3f < _left; _left = _left - 0x40) {
    if ((size_local & 3) == 0) {
      local_30 = (md5_ctx *)size_local;
    }
    else {
      memcpy(ctx,(void *)size_local,0x40);
      local_30 = ctx;
    }
    rhash_md5_process_block(ctx->hash,local_30->message);
    size_local = size_local + 0x40;
  }
  if (_left != 0) {
    memcpy(ctx,(void *)size_local,_left);
  }
  return;
}

Assistant:

void rhash_md5_update(md5_ctx *ctx, const unsigned char* msg, size_t size)
{
	unsigned index = (unsigned)ctx->length & 63;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		unsigned left = md5_block_size - index;
		le32_copy((char*)ctx->message, index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_md5_process_block(ctx->hash, ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= md5_block_size) {
		unsigned* aligned_message_block;
		if (IS_LITTLE_ENDIAN && IS_ALIGNED_32(msg)) {
			/* the most common case is processing a 32-bit aligned message
			on a little-endian CPU without copying it */
			aligned_message_block = (unsigned*)msg;
		} else {
			le32_copy(ctx->message, 0, msg, md5_block_size);
			aligned_message_block = ctx->message;
		}

		rhash_md5_process_block(ctx->hash, aligned_message_block);
		msg  += md5_block_size;
		size -= md5_block_size;
	}
	if (size) {
		/* save leftovers */
		le32_copy(ctx->message, 0, msg, size);
	}
}